

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O1

int av1_optimize_txb(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type
                    ,TXB_CTX *txb_ctx,int *rate_cost,int sharpness)

{
  CommonQuantParams *quant_params;
  short sVar1;
  MB_MODE_INFO *pMVar2;
  MACROBLOCKD *xd;
  byte bVar3;
  uint8_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  long lVar11;
  TX_CLASS tx_class;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int (*paiVar18) [8];
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int *piVar22;
  int col_1;
  int iVar23;
  int col_9;
  uint uVar24;
  int (*paiVar25) [8];
  uint uVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  TX_TYPE tx_type_00;
  int iVar30;
  int iVar31;
  undefined7 in_register_00000081;
  ulong uVar32;
  ulong uVar33;
  int16_t *piVar34;
  int iVar35;
  int iVar36;
  undefined7 in_register_00000089;
  int (*paiVar37) [26];
  int (*paiVar38) [26];
  int (*paiVar39) [26];
  tran_low_t *ptVar40;
  int iVar41;
  long lVar42;
  uint uVar43;
  tran_low_t *qcoeff;
  long lVar44;
  qm_val_t *iqmatrix;
  int (*paiVar45) [26];
  uint8_t *puVar46;
  int (*paiVar47) [8];
  bool bVar48;
  uint local_73c;
  int (*local_738) [26];
  int (*local_730) [26];
  int (*local_728) [26];
  int (*local_720) [26];
  int *local_718;
  undefined8 local_710;
  ulong local_708;
  int local_6fc;
  int col;
  undefined4 uStack_6f4;
  ulong local_6f0;
  int16_t *local_6e8;
  undefined8 local_6e0;
  int col_6;
  undefined4 uStack_6d4;
  LV_MAP_COEFF_COST *local_6d0;
  tran_low_t *local_6c8;
  long local_6c0;
  tran_low_t *local_6b8;
  ulong local_6b0;
  int (*local_6a8) [26];
  int (*local_6a0) [8];
  int (*local_698) [26];
  int (*local_690) [8];
  qm_val_t *local_688;
  int (*local_680) [26];
  MACROBLOCKD *local_678;
  int (*local_670) [26];
  int (*local_668) [8];
  int (*local_660) [8];
  LV_MAP_EOB_COST *local_658;
  int (*local_650) [26];
  int (*local_648) [26];
  undefined8 local_640;
  qm_val_t *local_638;
  tran_low_t *local_630;
  int (*local_628) [26];
  uint local_61c;
  int (*local_618) [3];
  int16_t *local_610;
  ulong local_608;
  int (*local_600) [26];
  uint8_t *local_5f8;
  int (*local_5f0) [3];
  uint8_t *local_5e8;
  ulong local_5e0;
  int nz_ci [3];
  int64_t dummy_dist;
  uint8_t levels_buf [1312];
  
  iVar6 = (int)CONCAT71(in_register_00000089,tx_type);
  local_6b8 = (tran_low_t *)CONCAT44(local_6b8._4_4_,iVar6);
  local_678 = &x->e_mbd;
  local_690 = (int (*) [8])(CONCAT71(in_register_00000081,tx_size) & 0xffffffff);
  uVar17 = (ulong)(uint)(iVar6 << 4);
  uVar5 = (int)CONCAT71(in_register_00000081,tx_size) << 8;
  local_6e8 = *(int16_t **)((long)&av1_scan_orders[0][0].scan + uVar17 + uVar5);
  local_6fc = plane;
  iVar6 = av1_get_tx_scale(tx_size);
  xd = local_678;
  ptVar40 = local_6b8;
  local_6e0 = CONCAT44(extraout_var,iVar6);
  local_708 = CONCAT44(local_708._4_4_,block);
  local_610 = x->plane[plane].dequant_QTX;
  local_6a8 = (int (*) [26])(ulong)x->plane[plane].eobs[block];
  quant_params = &(cpi->common).quant_params;
  tx_type_00 = (TX_TYPE)local_6b8;
  local_688 = av1_get_iqmatrix(quant_params,local_678,plane,tx_size,tx_type_00);
  uVar7 = (uint)tx_size;
  if ((cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR) {
    local_638 = av1_get_qmatrix(quant_params,xd,local_6fc,tx_size,tx_type_00);
  }
  else {
    local_638 = (qm_val_t *)0x0;
  }
  iqmatrix = local_688;
  uVar24 = (uint)tx_size;
  if (uVar7 < 0x11) {
    paiVar47 = (int (*) [8])0x3;
    if ((1 < uVar24 - 0xb) && (uVar24 != 4)) {
LAB_0036a8b2:
      paiVar47 = local_690;
    }
  }
  else if (uVar7 == 0x11) {
    paiVar47 = (int (*) [8])0x9;
  }
  else {
    if (uVar24 != 0x12) goto LAB_0036a8b2;
    paiVar47 = (int (*) [8])0xa;
  }
  iVar6 = (int)local_708 << 4;
  if (uVar7 < 0x11) {
    paiVar18 = (int (*) [8])0x3;
    if ((1 < uVar7 - 0xb) && (uVar24 != 4)) {
LAB_0036a903:
      paiVar18 = local_690;
    }
  }
  else if (uVar7 == 0x11) {
    paiVar18 = (int (*) [8])0x9;
  }
  else {
    if (uVar24 != 0x12) goto LAB_0036a903;
    paiVar18 = (int (*) [8])0xa;
  }
  pMVar2 = *(x->e_mbd).mi;
  if (uVar7 < 0x11) {
    paiVar25 = (int (*) [8])0x3;
    if ((1 < uVar24 - 0xb) && (uVar7 != 4)) {
LAB_0036a964:
      paiVar25 = local_690;
    }
  }
  else if (uVar7 == 0x11) {
    paiVar25 = (int (*) [8])0x9;
  }
  else {
    if (uVar7 != 0x12) goto LAB_0036a964;
    paiVar25 = (int (*) [8])0xa;
  }
  uVar32 = 1;
  if ((pMVar2->field_0xa7 & 0x80) == 0) {
    uVar32 = (ulong)('\0' < pMVar2->ref_frame[0]);
  }
  qcoeff = x->plane[plane].qcoeff + iVar6;
  local_6b8 = x->plane[plane].dqcoeff + iVar6;
  local_630 = x->plane[plane].coeff + iVar6;
  local_61c = (uint)""[(ulong)ptVar40 & 0xffffffff];
  uVar7 = tx_size_high_log2[(long)paiVar47];
  uVar33 = (ulong)uVar7;
  local_608 = (ulong)(uint)tx_size_wide[(long)paiVar18];
  bVar48 = local_6fc != 0;
  local_6d0 = (x->coeff_costs).coeff_costs
              [(uint)*(byte *)((long)(local_690 + 0x29344) + 0x10) +
               (uint)*(byte *)((long)(local_690 + 0x29345) + 0x10) + 1 >> 1 & 0xff] + bVar48;
  local_658 = (x->coeff_costs).eob_costs[*(char *)((long)(local_690 + 0x29343) + 0x10)] + bVar48;
  bVar3 = (((cpi->oxcf).tune_cfg.tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) * '\x02' | 5;
  local_6c0 = (long)((ulong)((uint)(1 << bVar3) >> 1) +
                    (long)(plane_rd_mult[uVar32][bVar48] <<
                          ((char)(x->e_mbd).bd * '\x02' - 0x10U & 0x1f)) *
                    (long)(8 - sharpness) * (long)x->rdmult) >> bVar3;
  if (1 < (ushort)local_6a8) {
    (*av1_txb_init_levels)
              (qcoeff,tx_size_wide[(long)paiVar18],tx_size_high[(long)paiVar25],levels_buf);
  }
  uVar8 = local_61c;
  paiVar38 = local_6a8;
  iVar6 = local_6d0->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  iVar10 = local_6d0->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  iVar23 = (int)local_6a8;
  tx_class = (TX_CLASS)local_61c;
  local_73c = get_eob_cost(iVar23,local_658,local_6d0,tx_class);
  ptVar40 = local_6b8;
  piVar34 = local_6e8;
  local_628 = (int (*) [26])0x0;
  nz_ci[0] = (int)local_6e8[(long)((long)(paiVar38 + -1) + 0x67)];
  uVar24 = qcoeff[nz_ci[0]];
  uVar9 = -uVar24;
  if (0 < (int)uVar24) {
    uVar9 = uVar24;
  }
  iVar20 = iVar23 + -1;
  nz_ci[1] = 0;
  nz_ci[2] = 0;
  bVar3 = (byte)uVar7;
  iVar35 = (int)local_608;
  if (uVar9 < 2) {
    if (iVar20 == 0) {
      uVar32 = 0;
    }
    else {
      bVar12 = bVar3 & 0x1f;
      iVar36 = iVar35 << bVar12;
      iVar23 = iVar36 + 7;
      if (-1 < iVar35 << bVar12) {
        iVar23 = iVar36;
      }
      uVar32 = 1;
      if (iVar23 >> 3 < iVar20) {
        iVar23 = iVar36 + 3;
        if (-1 < iVar35 << bVar12) {
          iVar23 = iVar36;
        }
        uVar32 = (ulong)(iVar23 >> 2 < iVar20) | 2;
      }
    }
    iVar23 = local_6d0->base_eob_cost[uVar32 - 1][(long)(int)uVar9 + 2];
    if (uVar24 != 0) {
      iVar20 = 0x200;
      if (local_6e8[(long)((long)(paiVar38 + -1) + 0x67)] == 0) {
        iVar20 = local_6d0->dc_sign_cost[txb_ctx->dc_sign_ctx][uVar24 >> 0x1f];
      }
      iVar23 = iVar23 + iVar20;
    }
    local_73c = iVar23 + local_73c;
    lVar11 = (long)(local_630[nz_ci[0]] - local_6b8[nz_ci[0]] << ((byte)local_6e0 & 0x1f));
    if (local_638 == (qm_val_t *)0x0) {
      uVar32 = lVar11 * lVar11;
    }
    else {
      uVar32 = (ulong)local_638[nz_ci[0]] * lVar11 * (ulong)local_638[nz_ci[0]] * lVar11 + 0x200 >>
               10;
    }
    lVar11 = (long)(local_630[nz_ci[0]] << ((byte)local_6e0 & 0x1f));
    if (local_638 == (qm_val_t *)0x0) {
      uVar29 = lVar11 * lVar11;
    }
    else {
      uVar29 = (ulong)local_638[nz_ci[0]] * lVar11 * (ulong)local_638[nz_ci[0]] * lVar11 + 0x200 >>
               10;
    }
    local_628 = (int (*) [26])(uVar32 - uVar29);
    paiVar38 = local_6a8;
  }
  else {
    update_coeff_general
              ((int *)&local_73c,(int64_t *)&local_628,iVar20,iVar23,tx_size,tx_class,uVar7,iVar35,
               local_6c0,(int)local_6e0,txb_ctx->dc_sign_ctx,local_610,local_6e8,local_6d0,local_630
               ,qcoeff,local_6b8,levels_buf,iqmatrix,local_638);
    uVar8 = local_61c;
  }
  uVar7 = (int)paiVar38 - 2;
  paiVar38 = (int (*) [26])(ulong)uVar7;
  iVar23 = (int)local_608;
  local_708 = uVar33;
  local_6c8 = qcoeff;
  if (uVar8 == 0) {
    uVar32 = (ulong)local_73c;
    local_728 = local_628;
    uVar24 = 1;
    if (1 < (ushort)local_6a8) {
      uVar24 = 1;
      local_680 = (int (*) [26])(long)(1 << (bVar3 & 0x1f));
      local_698 = (int (*) [26])(*local_680 + 1);
      local_600 = (int (*) [26])(long)(2 << (bVar3 & 0x1f));
      local_6a0 = local_6d0->base_cost;
      local_650 = (int (*) [26])local_6d0->dc_sign_cost;
      local_640 = local_6d0->lps_cost;
      iVar36 = iVar23 << (bVar3 & 0x1f);
      iVar35 = iVar36 + 3;
      iVar20 = iVar36 + 7;
      if (-1 < iVar23 << (bVar3 & 0x1f)) {
        iVar35 = iVar36;
        iVar20 = iVar36;
      }
      local_618 = local_6d0->base_eob_cost;
      local_5f0 = (int (*) [3])(long)(iVar20 >> 3);
      paiVar37 = paiVar38;
      do {
        sVar1 = piVar34[(long)paiVar37];
        uVar7 = (uint)sVar1;
        iVar23 = (int)local_610[uVar7 != 0];
        if (iqmatrix != (qm_val_t *)0x0) {
          iVar23 = (int)((uint)iqmatrix[(int)uVar7] * iVar23 + 0x10) >> 5;
        }
        bVar3 = (byte)local_708;
        uVar9 = (int)uVar7 >> (bVar3 & 0x1f);
        lVar11 = (long)(int)(uVar7 + uVar9 * 4);
        if (sVar1 == 0) {
          lVar44 = 0;
        }
        else {
          uVar8 = (uint)""[levels_buf[lVar11 + 2]] +
                  (uint)""[(levels_buf + lVar11 + 8)[(long)local_600]] +
                  (uint)""[(levels_buf + lVar11 + 5)[(long)local_680]] +
                  (uint)""[levels_buf[lVar11 + 1]] +
                  (uint)""[(levels_buf + lVar11)[(long)local_698]] + 1 >> 1;
          uVar33 = (ulong)uVar8;
          if (3 < uVar8) {
            uVar33 = 4;
          }
          lVar44 = uVar33 + (long)av1_nz_map_ctx_offset[(long)local_690][(int)uVar7];
        }
        uVar8 = qcoeff[(int)uVar7];
        if (uVar8 == 0) {
          uVar32 = (ulong)(uint)((int)uVar32 + local_6a0[lVar44][0]);
        }
        else {
          uVar15 = -uVar8;
          if (0 < (int)uVar8) {
            uVar15 = uVar8;
          }
          iVar20 = local_630[(int)uVar7];
          bVar12 = (byte)local_6e0;
          lVar42 = (long)(iVar20 << (bVar12 & 0x1f));
          if (local_638 == (qm_val_t *)0x0) {
            local_720 = (int (*) [26])(lVar42 * lVar42);
          }
          else {
            local_720 = (int (*) [26])
                        ((ulong)local_638[(int)uVar7] * lVar42 *
                         (ulong)local_638[(int)uVar7] * lVar42 + 0x200 >> 10);
          }
          lVar42 = (long)(iVar20 - local_6b8[(int)uVar7] << (bVar12 & 0x1f));
          if (local_638 == (qm_val_t *)0x0) {
            local_668 = (int (*) [8])(lVar42 * lVar42);
          }
          else {
            local_668 = (int (*) [8])
                        ((ulong)local_638[(int)uVar7] * lVar42 *
                         (ulong)local_638[(int)uVar7] * lVar42 + 0x200 >> 10);
          }
          local_6b0 = (ulong)txb_ctx->dc_sign_ctx;
          uVar8 = (int)uVar8 >> 0x1f;
          uVar43 = -uVar8;
          local_738 = (int (*) [26])(ulong)uVar43;
          local_5f8 = (uint8_t *)0x3;
          if ((int)uVar15 < 3) {
            local_5f8 = (uint8_t *)(ulong)uVar15;
          }
          iVar36 = 0x200;
          if (sVar1 == 0) {
            iVar36 = (*local_650)[local_6b0 * 2 + (long)local_738];
          }
          uVar21 = iVar36 + local_6a0[lVar44][(long)local_5f8];
          iVar36 = (int)local_698;
          if (2 < uVar15) {
            iVar30 = uVar7 - (uVar9 << (bVar3 & 0x1f));
            iVar41 = uVar9 * iVar36 + iVar30;
            lVar42 = (long)(iVar41 + iVar36);
            uVar14 = (uint)levels_buf[lVar42 + 1] +
                     (uint)levels_buf[lVar42] + (uint)levels_buf[(long)iVar41 + 1] + 1 >> 1;
            uVar33 = (ulong)uVar14;
            if (5 < uVar14) {
              uVar33 = 6;
            }
            if (sVar1 != 0) {
              if (((int)uVar9 < 2) && (iVar30 < 2)) {
                uVar33 = (ulong)((int)uVar33 + 7);
              }
              else {
                uVar33 = (ulong)((int)uVar33 + 0xe);
              }
            }
            uVar14 = 0x1f;
            if (uVar15 - 0xe != 0) {
              for (; uVar15 - 0xe >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            uVar14 = (uVar14 ^ 0x1f) << 10 ^ 0x7e00;
            uVar29 = 0xf;
            if ((int)uVar15 < 0xf) {
              uVar29 = (ulong)uVar15;
            }
            if (uVar15 < 0xf) {
              uVar14 = 0;
            }
            uVar21 = uVar21 + uVar14 + local_640[uVar33 - 1][uVar29 + 0x17];
          }
          local_718 = (int *)(ulong)uVar21;
          if (uVar15 == 1) {
            uVar14 = local_6a0[lVar44][0];
            local_710 = (int (*) [8])0x0;
            local_670 = local_728;
            iVar23 = 0;
            _col = (int (*) [26])0x0;
            uVar21 = 0;
          }
          else {
            uVar21 = uVar15 - 1;
            iVar23 = ((int)(iVar23 * uVar21) >> (bVar12 & 0x1f) ^ uVar8) + uVar43;
            lVar42 = (long)(iVar20 - iVar23 << (bVar12 & 0x1f));
            if (local_638 == (qm_val_t *)0x0) {
              uVar33 = lVar42 * lVar42;
            }
            else {
              uVar33 = (ulong)local_638[(int)uVar7] * lVar42 * (ulong)local_638[(int)uVar7] * lVar42
                       + 0x200 >> 10;
            }
            uVar29 = 3;
            if ((int)uVar21 < 3) {
              uVar29 = (ulong)uVar21;
            }
            iVar20 = 0x200;
            if (sVar1 == 0) {
              iVar20 = (*local_650)[local_6b0 * 2 + (ulong)uVar43];
            }
            uVar14 = iVar20 + local_6a0[lVar44][uVar29];
            if (3 < uVar15) {
              iVar20 = uVar7 - (uVar9 << (bVar3 & 0x1f));
              iVar30 = uVar9 * iVar36 + iVar20;
              lVar44 = (long)(iVar30 + iVar36);
              uVar26 = (uint)levels_buf[lVar44 + 1] +
                       (uint)levels_buf[lVar44] + (uint)levels_buf[(long)iVar30 + 1] + 1 >> 1;
              uVar29 = (ulong)uVar26;
              if (5 < uVar26) {
                uVar29 = 6;
              }
              if (sVar1 != 0) {
                if (((int)uVar9 < 2) && (iVar20 < 2)) {
                  uVar29 = (ulong)((int)uVar29 + 7);
                }
                else {
                  uVar29 = (ulong)((int)uVar29 + 0xe);
                }
              }
              uVar19 = 0xf;
              if ((int)uVar21 < 0xf) {
                uVar19 = (ulong)uVar21;
              }
              uVar26 = 0x1f;
              if (uVar15 - 0xf != 0) {
                for (; uVar15 - 0xf >> uVar26 == 0; uVar26 = uVar26 - 1) {
                }
              }
              uVar26 = (uVar26 ^ 0x1f) << 10 ^ 0x7e00;
              if (uVar15 < 0x10) {
                uVar26 = 0;
              }
              uVar14 = uVar14 + uVar26 + local_640[uVar29 - 1][uVar19 + 0x17];
            }
            local_710 = (int (*) [8])(ulong)((uVar8 ^ uVar21) + uVar43);
            _col = (int (*) [26])(uVar33 - (long)local_720);
            local_670 = (int (*) [26])((long)local_728 + (long)_col);
          }
          local_5e0 = (ulong)uVar14;
          local_660 = (int (*) [8])CONCAT44(local_660._4_4_,iVar23);
          if (paiVar37 == (int (*) [26])0x0) {
            uVar33 = 0;
          }
          else {
            uVar33 = 1;
            if ((long)local_5f0 < (long)paiVar37) {
              uVar33 = (ulong)((long)(iVar35 >> 2) < (long)paiVar37) | 2;
            }
          }
          local_648 = (int (*) [26])((long)*paiVar37 + 1);
          local_730 = (int (*) [26])(ulong)uVar7;
          local_6f0 = uVar32;
          _col_6 = (int (*) [26])(ulong)uVar9;
          local_5e8 = levels_buf + lVar11;
          iVar20 = get_eob_cost((int)local_648,local_658,local_6d0,'\0');
          paiVar38 = local_720;
          iVar23 = 0x200;
          if (sVar1 == 0) {
            iVar23 = (*local_650)[local_6b0 * 2 + ((ulong)local_738 & 0xffffffff)];
          }
          iVar23 = iVar23 + local_618[uVar33 - 1][(long)(int)local_5f8 + 2];
          iVar36 = (int)_col_6;
          bVar3 = (byte)local_708;
          iVar30 = (int)local_730;
          if (2 < uVar15) {
            if (sVar1 == 0) {
              lVar11 = 0;
            }
            else {
              lVar11 = 0xe;
              if (iVar36 < 2) {
                lVar11 = 7;
              }
              if (1 < iVar30 - (iVar36 << (bVar3 & 0x1f))) {
                lVar11 = 0xe;
              }
            }
            uVar9 = 0x1f;
            if (uVar15 - 0xe != 0) {
              for (; uVar15 - 0xe >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            uVar9 = (uVar9 ^ 0x1f) << 10 ^ 0x7e00;
            uVar32 = 0xf;
            if ((int)uVar15 < 0xf) {
              uVar32 = (ulong)uVar15;
            }
            if (uVar15 < 0xf) {
              uVar9 = 0;
            }
            iVar23 = iVar23 + uVar9 + local_640[lVar11 + -1][uVar32 + 0x17];
          }
          paiVar39 = (int (*) [26])((long)local_668 - (long)local_720);
          uVar32 = (ulong)(uint)(iVar23 + iVar20);
          lVar11 = (long)paiVar39 * 0x80 + ((iVar23 + iVar20) * local_6c0 + 0x100 >> 9);
          local_720 = (int (*) [26])((ulong)local_720 & 0xffffffff00000000);
          paiVar45 = paiVar39;
          if ((int)uVar21 < 1) {
            iVar23 = 0;
          }
          else {
            uVar9 = 3;
            if ((int)uVar21 < 3) {
              uVar9 = uVar21;
            }
            iVar41 = 0x200;
            if ((short)local_730 == 0) {
              local_668 = (int (*) [8])CONCAT44(local_668._4_4_,iVar20);
              iVar41 = (*local_650)[local_6b0 * 2 + ((ulong)local_738 & 0xffffffff)];
            }
            iVar41 = iVar41 + local_618[uVar33 - 1][(long)(int)uVar9 + 2];
            if (2 < (int)uVar21) {
              if (sVar1 == 0) {
                lVar44 = 0;
              }
              else {
                lVar44 = 0xe;
                if (iVar36 < 2) {
                  lVar44 = 7;
                }
                if (1 < iVar30 - (iVar36 << (bVar3 & 0x1f))) {
                  lVar44 = 0xe;
                }
              }
              uVar9 = 0x1f;
              if (uVar21 - 0xe != 0) {
                for (; uVar21 - 0xe >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = (uVar9 ^ 0x1f) << 10 ^ 0x7e00;
              uVar33 = 0xf;
              if ((int)uVar21 < 0xf) {
                uVar33 = (ulong)uVar21;
                uVar9 = 0;
              }
              iVar41 = iVar41 + uVar9 + local_640[lVar44 + -1][uVar33 + 0x17];
            }
            lVar44 = (long)_col * 0x80 + ((iVar41 + iVar20) * local_6c0 + 0x100 >> 9);
            iVar23 = 0;
            if (lVar44 < lVar11) {
              iVar23 = 1;
              uVar32 = (ulong)(uint)(iVar41 + iVar20);
              lVar11 = lVar44;
              paiVar45 = _col;
            }
          }
          iVar20 = (int)local_6f0;
          local_738 = (int (*) [26])CONCAT44(local_738._4_4_,iVar23);
          lVar44 = (long)((long)local_728 + (long)paiVar39) * 0x80 +
                   ((iVar20 + (int)local_718) * local_6c0 + 0x100 >> 9);
          if ((((long)paiVar37 < 6) + 1 < uVar15 || sharpness == 0) &&
             (lVar42 = (long)local_670 * 0x80 + (((int)local_5e0 + iVar20) * local_6c0 + 0x100 >> 9)
             , lVar42 < lVar44)) {
            local_720._4_4_ = SUB84(paiVar38,4);
            local_720 = (int (*) [26])CONCAT44(local_720._4_4_,1);
            local_718 = (int *)(local_5e0 & 0xffffffff);
            paiVar39 = _col;
            lVar44 = lVar42;
          }
          if ((sharpness == 0 || 3 < (long)paiVar37) && (lVar11 < lVar44)) {
            if ((int)uVar24 < 1) {
              uVar24 = 0;
              local_6a8 = local_648;
            }
            else {
              uVar33 = (ulong)uVar24;
              uVar29 = 0;
              do {
                iVar20 = nz_ci[uVar29];
                levels_buf[iVar20 + (iVar20 >> (bVar3 & 0x1f)) * 4] = '\0';
                uVar24 = 0;
                local_6c8[iVar20] = 0;
                local_6b8[iVar20] = 0;
                uVar29 = uVar29 + 1;
              } while (uVar33 != uVar29);
              local_6a8 = local_648;
            }
          }
          else {
            paiVar45 = (int (*) [26])((long)*local_728 + (long)*paiVar39);
            uVar32 = (ulong)(uint)((int)local_718 + iVar20);
            iVar23 = (int)local_720;
          }
          if (iVar23 != 0) {
            local_6c8[(int)uVar7] = (tran_low_t)local_710;
            local_6b8[(int)uVar7] = (tran_low_t)local_660;
            if (0x7e < (int)uVar21) {
              uVar21 = 0x7f;
            }
            *local_5e8 = (uint8_t)uVar21;
          }
          qcoeff = local_6c8;
          iqmatrix = local_688;
          local_728 = paiVar45;
          if (local_6c8[(int)uVar7] != 0) {
            nz_ci[(int)uVar24] = iVar30;
            uVar24 = uVar24 + 1;
          }
        }
        paiVar38 = (int (*) [26])((long)(paiVar37 + -1) + 0x67);
        piVar34 = local_6e8;
      } while ((0 < (long)paiVar37) && (paiVar37 = paiVar38, (int)uVar24 < 3));
      local_73c = (uint)uVar32;
      ptVar40 = local_6b8;
      uVar33 = local_708;
      local_628 = local_728;
    }
  }
  else if (uVar8 == 1) {
    paiVar37 = (int (*) [26])(ulong)local_73c;
    local_730 = local_628;
    uVar24 = 1;
    if (1 < (ushort)local_6a8) {
      uVar24 = 1;
      _col_6 = (int (*) [26])((long)(1 << (bVar3 & 0x1f)) + 4);
      local_5e8 = (uint8_t *)(long)(2 << (bVar3 & 0x1f));
      local_640 = (int (*) [26])(long)(3 << (bVar3 & 0x1f));
      local_648 = (int (*) [26])(long)(4 << (bVar3 & 0x1f));
      local_660 = local_6d0->base_cost;
      local_618 = (int (*) [3])local_6d0->dc_sign_cost;
      iVar20 = (int)_col_6 * 2;
      iVar30 = iVar23 << (bVar3 & 0x1f);
      local_680 = local_6d0->lps_cost;
      iVar36 = iVar30 + 3;
      iVar35 = iVar30 + 7;
      if (-1 < iVar23 << (bVar3 & 0x1f)) {
        iVar36 = iVar30;
        iVar35 = iVar30;
      }
      local_5f0 = local_6d0->base_eob_cost;
      do {
        sVar1 = piVar34[(long)paiVar38];
        iVar30 = (int)sVar1;
        local_720 = (int (*) [26])CONCAT44(local_720._4_4_,iVar30);
        iVar23 = (int)local_610[sVar1 != 0];
        if (iqmatrix != (qm_val_t *)0x0) {
          iVar23 = (int)((uint)iqmatrix[iVar30] * iVar23 + 0x10) >> 5;
        }
        local_710 = (int (*) [8])CONCAT44(local_710._4_4_,iVar23);
        bVar3 = (byte)uVar33;
        iVar41 = iVar30 >> (bVar3 & 0x1f);
        lVar11 = (long)(iVar30 + iVar41 * 4);
        paiVar47 = (int (*) [8])(levels_buf + lVar11);
        uVar7 = (uint)""[*(byte *)((long)(*local_648 + 4) + (long)paiVar47)] +
                (uint)""[*(byte *)((long)(*local_640 + 3) + (long)paiVar47)] +
                (uint)""[(local_5e8 + 8)[(long)paiVar47]] +
                (uint)""[levels_buf[lVar11 + 1]] +
                (uint)""[*(byte *)((long)*(int (*) [26])(paiVar47 + 0x2d) +
                                  (long)((long)(_col_6 + -0xe) + 0x10))] + 1 >> 1;
        if (3 < uVar7) {
          uVar7 = 4;
        }
        uVar9 = qcoeff[iVar30];
        local_728 = paiVar38;
        if (uVar9 == 0) {
          paiVar37 = (int (*) [26])
                     (ulong)(uint)((int)paiVar37 +
                                  local_660[(ulong)uVar7 + (long)nz_map_ctx_offset_1d[iVar41]][0]);
        }
        else {
          uVar8 = -uVar9;
          if (0 < (int)uVar9) {
            uVar8 = uVar9;
          }
          iVar16 = local_630[iVar30];
          bVar12 = (byte)local_6e0;
          lVar11 = (long)(iVar16 << (bVar12 & 0x1f));
          if (local_638 == (qm_val_t *)0x0) {
            local_6f0 = lVar11 * lVar11;
          }
          else {
            local_6f0 = (ulong)local_638[iVar30] * lVar11 * (ulong)local_638[iVar30] * lVar11 +
                        0x200 >> 10;
          }
          lVar11 = (long)(iVar16 - ptVar40[iVar30] << (bVar12 & 0x1f));
          if (local_638 == (qm_val_t *)0x0) {
            local_5f8 = (uint8_t *)(lVar11 * lVar11);
          }
          else {
            local_5f8 = (uint8_t *)
                        ((ulong)local_638[iVar30] * lVar11 * (ulong)local_638[iVar30] * lVar11 +
                         0x200 >> 10);
          }
          local_6a0 = (int (*) [8])(long)txb_ctx->dc_sign_ctx;
          uVar9 = (int)uVar9 >> 0x1f;
          uVar15 = -uVar9;
          local_738 = (int (*) [26])(ulong)uVar15;
          local_6b0 = 3;
          if ((int)uVar8 < 3) {
            local_6b0 = (ulong)uVar8;
          }
          iVar31 = 0x200;
          if (sVar1 == 0) {
            iVar31 = (*local_618)[(long)local_6a0 * 2 + (long)local_738];
          }
          iVar27 = (int)((ulong)uVar7 + (long)nz_map_ctx_offset_1d[iVar41]);
          uVar7 = iVar31 + local_660[iVar27][local_6b0];
          iVar31 = (int)_col_6;
          if (2 < uVar8) {
            iVar28 = iVar41 * iVar31 + (iVar30 - (iVar41 << (bVar3 & 0x1f)));
            uVar43 = (uint)levels_buf[iVar28 + iVar20] +
                     (uint)levels_buf[iVar31 + iVar28] + (uint)levels_buf[(long)iVar28 + 1] + 1 >> 1
            ;
            if (5 < uVar43) {
              uVar43 = 6;
            }
            if (sVar1 != 0) {
              if (iVar41 == 0) {
                uVar43 = uVar43 + 7;
              }
              else {
                uVar43 = uVar43 + 0xe;
              }
            }
            uVar21 = 0x1f;
            if (uVar8 - 0xe != 0) {
              for (; uVar8 - 0xe >> uVar21 == 0; uVar21 = uVar21 - 1) {
              }
            }
            uVar21 = (uVar21 ^ 0x1f) << 10 ^ 0x7e00;
            uVar32 = 0xf;
            if ((int)uVar8 < 0xf) {
              uVar32 = (ulong)uVar8;
            }
            if (uVar8 < 0xf) {
              uVar21 = 0;
            }
            uVar7 = uVar7 + uVar21 + local_680[(ulong)uVar43 - 1][uVar32 + 0x17];
          }
          local_718 = (int *)(ulong)uVar7;
          if (uVar8 == 1) {
            uVar43 = local_660[iVar27][0];
            local_650 = (int (*) [26])0x0;
            local_670 = local_730;
            local_710 = (int (*) [8])((ulong)local_710._4_4_ << 0x20);
            local_698 = (int (*) [26])0x0;
            uVar7 = 0;
          }
          else {
            uVar7 = uVar8 - 1;
            iVar23 = ((int)(iVar23 * uVar7) >> (bVar12 & 0x1f) ^ uVar9) + uVar15;
            local_710 = (int (*) [8])CONCAT44(local_710._4_4_,iVar23);
            lVar11 = (long)(iVar16 - iVar23 << (bVar12 & 0x1f));
            if (local_638 == (qm_val_t *)0x0) {
              uVar32 = lVar11 * lVar11;
            }
            else {
              uVar32 = (ulong)local_638[iVar30] * lVar11 * (ulong)local_638[iVar30] * lVar11 + 0x200
                       >> 10;
            }
            uVar33 = 3;
            if ((int)uVar7 < 3) {
              uVar33 = (ulong)uVar7;
            }
            iVar23 = 0x200;
            if (sVar1 == 0) {
              iVar23 = (*local_618)[(long)local_6a0 * 2 + (ulong)uVar15];
            }
            uVar43 = iVar23 + local_660[iVar27][uVar33];
            if (3 < uVar8) {
              iVar23 = iVar41 * iVar31 + (iVar30 - (iVar41 << (bVar3 & 0x1f)));
              uVar21 = (uint)levels_buf[iVar23 + iVar20] +
                       (uint)levels_buf[iVar31 + iVar23] + (uint)levels_buf[(long)iVar23 + 1] + 1 >>
                       1;
              if (5 < uVar21) {
                uVar21 = 6;
              }
              if (sVar1 != 0) {
                if (iVar41 == 0) {
                  uVar21 = uVar21 + 7;
                }
                else {
                  uVar21 = uVar21 + 0xe;
                }
              }
              uVar33 = 0xf;
              if ((int)uVar7 < 0xf) {
                uVar33 = (ulong)uVar7;
              }
              uVar14 = 0x1f;
              if (uVar8 - 0xf != 0) {
                for (; uVar8 - 0xf >> uVar14 == 0; uVar14 = uVar14 - 1) {
                }
              }
              uVar14 = (uVar14 ^ 0x1f) << 10 ^ 0x7e00;
              if (uVar8 < 0x10) {
                uVar14 = 0;
              }
              uVar43 = uVar43 + uVar14 + local_680[(ulong)uVar21 - 1][uVar33 + 0x17];
            }
            local_650 = (int (*) [26])(ulong)((uVar9 ^ uVar7) + uVar15);
            local_698 = (int (*) [26])(uVar32 - local_6f0);
            local_670 = (int (*) [26])((long)local_730 + (long)local_698);
          }
          local_5e0 = (ulong)uVar43;
          if (paiVar38 == (int (*) [26])0x0) {
            uVar32 = 0;
          }
          else {
            uVar32 = 1;
            if ((long)(iVar35 >> 3) < (long)paiVar38) {
              uVar32 = (ulong)((long)(iVar36 >> 2) < (long)paiVar38) | 2;
            }
          }
          local_600 = (int (*) [26])((long)*paiVar38 + 1);
          _col = paiVar37;
          local_668 = paiVar47;
          iVar16 = get_eob_cost((int)local_600,local_658,local_6d0,'\x01');
          uVar33 = local_6f0;
          iVar23 = 0x200;
          if (sVar1 == 0) {
            iVar23 = (*local_618)[(long)local_6a0 * 2 + ((ulong)local_738 & 0xffffffff)];
          }
          iVar23 = iVar23 + local_5f0[uVar32 - 1][(long)(int)local_6b0 + 2];
          if (2 < uVar8) {
            lVar11 = 0xe;
            if (iVar41 == 0) {
              lVar11 = 7;
            }
            lVar44 = 0;
            if (sVar1 != 0) {
              lVar44 = lVar11;
            }
            uVar9 = 0x1f;
            if (uVar8 - 0xe != 0) {
              for (; uVar8 - 0xe >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            uVar9 = (uVar9 ^ 0x1f) << 10 ^ 0x7e00;
            uVar29 = 0xf;
            if ((int)uVar8 < 0xf) {
              uVar29 = (ulong)uVar8;
            }
            if (uVar8 < 0xf) {
              uVar9 = 0;
            }
            iVar23 = iVar23 + uVar9 + local_680[lVar44 + -1][uVar29 + 0x17];
          }
          paiVar38 = (int (*) [26])(local_5f8 + -local_6f0);
          paiVar37 = (int (*) [26])(ulong)(uint)(iVar23 + iVar16);
          lVar11 = (long)paiVar38 * 0x80 + ((iVar23 + iVar16) * local_6c0 + 0x100 >> 9);
          local_6f0 = local_6f0 & 0xffffffff00000000;
          if ((int)uVar7 < 1) {
            iVar23 = 0;
            local_738 = paiVar38;
          }
          else {
            uVar9 = 3;
            if ((int)uVar7 < 3) {
              uVar9 = uVar7;
            }
            iVar31 = 0x200;
            if (sVar1 == 0) {
              iVar31 = (*local_618)[(long)local_6a0 * 2 + ((ulong)local_738 & 0xffffffff)];
            }
            iVar31 = iVar31 + local_5f0[uVar32 - 1][(long)(int)uVar9 + 2];
            if (2 < (int)uVar7) {
              lVar44 = 0xe;
              if (iVar41 == 0) {
                lVar44 = 7;
              }
              lVar42 = 0;
              if (sVar1 != 0) {
                lVar42 = lVar44;
              }
              uVar9 = 0x1f;
              if (uVar7 - 0xe != 0) {
                for (; uVar7 - 0xe >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = (uVar9 ^ 0x1f) << 10 ^ 0x7e00;
              uVar32 = 0xf;
              if ((int)uVar7 < 0xf) {
                uVar32 = (ulong)uVar7;
                uVar9 = 0;
              }
              iVar31 = iVar31 + uVar9 + local_680[lVar42 + -1][uVar32 + 0x17];
            }
            lVar44 = (long)local_698 * 0x80 + ((iVar31 + iVar16) * local_6c0 + 0x100 >> 9);
            iVar23 = 0;
            local_738 = paiVar38;
            if (lVar44 < lVar11) {
              iVar23 = 1;
              paiVar37 = (int (*) [26])(ulong)(uint)(iVar31 + iVar16);
              local_738 = local_698;
              lVar11 = lVar44;
            }
          }
          local_6b0 = CONCAT44(local_6b0._4_4_,iVar23);
          iVar41 = (int)_col;
          lVar44 = (long)((long)*paiVar38 + (long)*local_730) * 0x80 +
                   ((iVar41 + (int)local_718) * local_6c0 + 0x100 >> 9);
          if ((((long)local_728 < 6) + 1 < uVar8 || sharpness == 0) &&
             (lVar42 = (long)local_670 * 0x80 + (((int)local_5e0 + iVar41) * local_6c0 + 0x100 >> 9)
             , lVar42 < lVar44)) {
            local_6f0._4_4_ = SUB84(uVar33,4);
            local_6f0 = CONCAT44(local_6f0._4_4_,1);
            local_718 = (int *)(local_5e0 & 0xffffffff);
            paiVar38 = local_698;
            lVar44 = lVar42;
          }
          if ((sharpness == 0 || 3 < (long)local_728) && (lVar11 < lVar44)) {
            if (0 < (int)uVar24) {
              uVar32 = 0;
              do {
                iVar41 = nz_ci[uVar32];
                levels_buf[iVar41 + (iVar41 >> ((byte)local_708 & 0x1f)) * 4] = '\0';
                local_6c8[iVar41] = 0;
                local_6b8[iVar41] = 0;
                uVar32 = uVar32 + 1;
              } while (uVar24 != uVar32);
            }
            uVar24 = 0;
            local_730 = local_738;
            local_6a8 = local_600;
          }
          else {
            local_730 = (int (*) [26])((long)*local_730 + (long)*paiVar38);
            paiVar37 = (int (*) [26])(ulong)(uint)((int)local_718 + iVar41);
            iVar23 = (int)local_6f0;
          }
          if (iVar23 != 0) {
            local_6c8[iVar30] = (tran_low_t)local_650;
            local_6b8[iVar30] = (tran_low_t)local_710;
            uVar4 = (uint8_t)uVar7;
            if (0x7e < (int)uVar7) {
              uVar4 = '\x7f';
            }
            *(uint8_t *)*local_668 = uVar4;
          }
          piVar34 = local_6e8;
          ptVar40 = local_6b8;
          uVar33 = local_708;
          qcoeff = local_6c8;
          iqmatrix = local_688;
          if (local_6c8[iVar30] != 0) {
            nz_ci[(int)uVar24] = (int)local_720;
            uVar24 = uVar24 + 1;
          }
        }
        paiVar38 = (int (*) [26])((long)(local_728 + -1) + 0x67);
      } while ((0 < (long)local_728) && ((int)uVar24 < 3));
    }
    local_73c = (uint)paiVar37;
    local_628 = local_730;
  }
  else {
    uVar24 = 1;
    if (uVar8 == 2) {
      piVar22 = (int *)(ulong)local_73c;
      local_738 = local_628;
      uVar24 = 1;
      if (1 < (ushort)local_6a8) {
        uVar24 = 1;
        local_6b0 = (long)(1 << (bVar3 & 0x1f)) + 4;
        local_5e8 = (uint8_t *)CONCAT44(local_5e8._4_4_,~(-1 << (bVar3 & 0x1f)));
        local_668 = local_6d0->base_cost;
        local_680 = (int (*) [26])local_6d0->dc_sign_cost;
        local_648 = local_6d0->lps_cost;
        iVar20 = iVar23 << (bVar3 & 0x1f);
        bVar48 = -1 < iVar23 << (bVar3 & 0x1f);
        iVar23 = iVar20 + 7;
        if (bVar48) {
          iVar23 = iVar20;
        }
        iVar35 = iVar20 + 3;
        if (bVar48) {
          iVar35 = iVar20;
        }
        local_600 = (int (*) [26])local_6d0->base_eob_cost;
        paiVar38 = (int (*) [26])(ulong)uVar7;
        local_5f0 = (int (*) [3])(long)(iVar35 >> 2);
        local_618 = (int (*) [3])(long)(iVar23 >> 3);
        do {
          sVar1 = piVar34[(long)paiVar38];
          uVar7 = (uint)sVar1;
          local_728 = (int (*) [26])CONCAT44(local_728._4_4_,uVar7);
          iVar23 = (int)local_610[sVar1 != 0];
          if (iqmatrix != (qm_val_t *)0x0) {
            iVar23 = (int)((uint)iqmatrix[(int)uVar7] * iVar23 + 0x10) >> 5;
          }
          bVar3 = (byte)uVar33;
          uVar8 = (int)uVar7 >> (bVar3 & 0x1f);
          _col = (int (*) [26])(ulong)uVar8;
          lVar11 = (long)(int)(uVar7 + uVar8 * 4);
          uVar9 = (uint)""[levels_buf[lVar11 + 4]] +
                  (uint)""[levels_buf[lVar11 + 3]] +
                  (uint)""[levels_buf[lVar11 + 2]] + (uint)""[levels_buf[lVar11 + 1]] +
                  (uint)""[(levels_buf + lVar11)[local_6b0]] + 1 >> 1;
          if (3 < uVar9) {
            uVar9 = 4;
          }
          uVar15 = qcoeff[(int)uVar7];
          local_718 = piVar22;
          if (uVar15 == 0) {
            piVar22 = (int *)(ulong)(uint)((int)piVar22 +
                                          local_668[(ulong)uVar9 +
                                                    (long)nz_map_ctx_offset_1d
                                                          [uVar7 & (uint)local_5e8]][0]);
            paiVar47 = (int (*) [8])paiVar38;
          }
          else {
            uVar43 = -uVar15;
            if (0 < (int)uVar15) {
              uVar43 = uVar15;
            }
            iVar20 = local_630[(int)uVar7];
            bVar12 = (byte)local_6e0;
            lVar44 = (long)(iVar20 << (bVar12 & 0x1f));
            if (local_638 == (qm_val_t *)0x0) {
              uVar32 = lVar44 * lVar44;
            }
            else {
              uVar32 = (ulong)local_638[(int)uVar7] * lVar44 * (ulong)local_638[(int)uVar7] * lVar44
                       + 0x200 >> 10;
            }
            lVar44 = (long)(iVar20 - ptVar40[(int)uVar7] << (bVar12 & 0x1f));
            if (local_638 == (qm_val_t *)0x0) {
              local_698 = (int (*) [26])(lVar44 * lVar44);
            }
            else {
              local_698 = (int (*) [26])
                          ((ulong)local_638[(int)uVar7] * lVar44 *
                           (ulong)local_638[(int)uVar7] * lVar44 + 0x200 >> 10);
            }
            local_660 = (int (*) [8])(long)txb_ctx->dc_sign_ctx;
            uVar15 = (int)uVar15 >> 0x1f;
            uVar21 = -uVar15;
            local_720 = (int (*) [26])(ulong)uVar21;
            local_5e0 = 3;
            if ((int)uVar43 < 3) {
              local_5e0 = (ulong)uVar43;
            }
            iVar35 = 0x200;
            if (sVar1 == 0) {
              iVar35 = (*local_680)[(long)local_660 * 2 + (long)local_720];
            }
            iVar36 = (int)((ulong)uVar9 + (long)nz_map_ctx_offset_1d[uVar7 & (uint)local_5e8]);
            uVar9 = iVar35 + local_668[iVar36][local_5e0];
            iVar35 = (int)local_6b0;
            if (2 < uVar43) {
              uVar26 = uVar8 << (bVar3 & 0x1f);
              iVar30 = uVar8 * iVar35 + (uVar7 - uVar26);
              uVar14 = (uint)levels_buf[(long)iVar30 + 2] +
                       (uint)levels_buf[iVar35 + iVar30] + (uint)levels_buf[(long)iVar30 + 1] + 1 >>
                       1;
              if (5 < uVar14) {
                uVar14 = 6;
              }
              if (sVar1 != 0) {
                if (uVar7 == uVar26) {
                  uVar14 = uVar14 + 7;
                }
                else {
                  uVar14 = uVar14 + 0xe;
                }
              }
              uVar26 = 0x1f;
              if (uVar43 - 0xe != 0) {
                for (; uVar43 - 0xe >> uVar26 == 0; uVar26 = uVar26 - 1) {
                }
              }
              uVar26 = (uVar26 ^ 0x1f) << 10 ^ 0x7e00;
              uVar33 = 0xf;
              if ((int)uVar43 < 0xf) {
                uVar33 = (ulong)uVar43;
              }
              if (uVar43 < 0xf) {
                uVar26 = 0;
              }
              uVar9 = uVar9 + uVar26 + local_648[(ulong)uVar14 - 1][uVar33 + 0x17];
            }
            local_730 = (int (*) [26])(ulong)uVar9;
            if (uVar43 == 1) {
              uVar14 = local_668[iVar36][0];
              local_6f0 = 0;
              local_670 = local_738;
              local_640 = (int (*) [26])((ulong)local_640._4_4_ << 0x20);
              _col_6 = (int (*) [26])0x0;
              uVar9 = 0;
            }
            else {
              uVar9 = uVar43 - 1;
              iVar23 = ((int)(iVar23 * uVar9) >> (bVar12 & 0x1f) ^ uVar15) + uVar21;
              local_640 = (int (*) [26])CONCAT44(local_640._4_4_,iVar23);
              lVar44 = (long)(iVar20 - iVar23 << (bVar12 & 0x1f));
              if (local_638 == (qm_val_t *)0x0) {
                uVar33 = lVar44 * lVar44;
              }
              else {
                uVar33 = (ulong)local_638[(int)uVar7] * lVar44 *
                         (ulong)local_638[(int)uVar7] * lVar44 + 0x200 >> 10;
              }
              uVar29 = 3;
              if ((int)uVar9 < 3) {
                uVar29 = (ulong)uVar9;
              }
              iVar23 = 0x200;
              if (sVar1 == 0) {
                iVar23 = (*local_680)[(long)local_660 * 2 + (ulong)uVar21];
              }
              uVar14 = iVar23 + local_668[iVar36][uVar29];
              if (3 < uVar43) {
                uVar26 = uVar8 << (bVar3 & 0x1f);
                iVar23 = uVar8 * iVar35 + (uVar7 - uVar26);
                uVar8 = (uint)levels_buf[(long)iVar23 + 2] +
                        (uint)levels_buf[iVar23 + iVar35] + (uint)levels_buf[(long)iVar23 + 1] + 1
                        >> 1;
                uVar29 = (ulong)uVar8;
                if (5 < uVar8) {
                  uVar29 = 6;
                }
                if (sVar1 != 0) {
                  if (uVar7 == uVar26) {
                    uVar29 = (ulong)((int)uVar29 + 7);
                  }
                  else {
                    uVar29 = (ulong)((int)uVar29 + 0xe);
                  }
                }
                uVar19 = 0xf;
                if ((int)uVar9 < 0xf) {
                  uVar19 = (ulong)uVar9;
                }
                uVar8 = 0x1f;
                if (uVar43 - 0xf != 0) {
                  for (; uVar43 - 0xf >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                uVar8 = (uVar8 ^ 0x1f) << 10 ^ 0x7e00;
                if (uVar43 < 0x10) {
                  uVar8 = 0;
                }
                uVar14 = uVar14 + uVar8 + local_648[uVar29 - 1][uVar19 + 0x17];
              }
              local_6f0 = (ulong)((uVar15 ^ uVar9) + uVar21);
              _col_6 = (int (*) [26])(uVar33 - uVar32);
              local_670 = (int (*) [26])((long)local_738 + (long)_col_6);
            }
            local_6a0 = (int (*) [8])(ulong)uVar14;
            if (paiVar38 == (int (*) [26])0x0) {
              uVar33 = 0;
            }
            else {
              uVar33 = 1;
              if ((long)local_618 < (long)paiVar38) {
                uVar33 = (ulong)((long)local_5f0 < (long)paiVar38) | 2;
              }
            }
            local_650 = (int (*) [26])((long)*(int (*) [8])paiVar38 + 1);
            local_710 = (int (*) [8])paiVar38;
            local_5f8 = levels_buf + lVar11;
            iVar20 = get_eob_cost((int)local_650,local_658,local_6d0,'\x02');
            paiVar38 = local_698;
            iVar23 = 0x200;
            if (sVar1 == 0) {
              iVar23 = (*local_680)[(long)local_660 * 2 + ((ulong)local_720 & 0xffffffff)];
            }
            iVar23 = iVar23 + *(int *)((long)(local_600 + -1) +
                                      (uVar33 * 3 + (long)(int)local_5e0 + 0x19) * 4);
            bVar3 = (byte)local_708;
            if (2 < uVar43) {
              lVar11 = 0xe;
              if ((int)_col << (bVar3 & 0x1f) == (int)local_728) {
                lVar11 = 7;
              }
              lVar44 = 0;
              if (sVar1 != 0) {
                lVar44 = lVar11;
              }
              uVar8 = 0x1f;
              if (uVar43 - 0xe != 0) {
                for (; uVar43 - 0xe >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              uVar8 = (uVar8 ^ 0x1f) << 10 ^ 0x7e00;
              uVar29 = 0xf;
              if ((int)uVar43 < 0xf) {
                uVar29 = (ulong)uVar43;
              }
              if (uVar43 < 0xf) {
                uVar8 = 0;
              }
              iVar23 = iVar23 + uVar8 + local_648[lVar44 + -1][uVar29 + 0x17];
            }
            paiVar37 = (int (*) [26])((long)local_698 - uVar32);
            piVar22 = (int *)(ulong)(uint)(iVar23 + iVar20);
            lVar11 = (long)paiVar37 * 0x80 + ((iVar23 + iVar20) * local_6c0 + 0x100 >> 9);
            local_698 = (int (*) [26])((ulong)local_698 & 0xffffffff00000000);
            if ((int)uVar9 < 1) {
              iVar23 = 0;
              local_720 = paiVar37;
            }
            else {
              uVar8 = 3;
              if ((int)uVar9 < 3) {
                uVar8 = uVar9;
              }
              iVar35 = 0x200;
              if (sVar1 == 0) {
                iVar35 = (*local_680)[(long)local_660 * 2 + ((ulong)local_720 & 0xffffffff)];
              }
              iVar35 = iVar35 + *(int *)((long)(local_600 + -1) +
                                        (uVar33 * 3 + (long)(int)uVar8 + 0x19) * 4);
              if (2 < (int)uVar9) {
                lVar44 = 0xe;
                if ((int)_col << (bVar3 & 0x1f) == (int)local_728) {
                  lVar44 = 7;
                }
                lVar42 = 0;
                if (sVar1 != 0) {
                  lVar42 = lVar44;
                }
                uVar8 = 0x1f;
                if (uVar9 - 0xe != 0) {
                  for (; uVar9 - 0xe >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                uVar32 = 0xf;
                if ((int)uVar9 < 0xf) {
                  uVar32 = (ulong)uVar9;
                }
                uVar8 = (uVar8 ^ 0x1f) << 10 ^ 0x7e00;
                if ((int)uVar9 < 0xf) {
                  uVar8 = 0;
                }
                iVar35 = iVar35 + uVar8 + local_648[lVar42 + -1][uVar32 + 0x17];
              }
              lVar44 = (long)_col_6 * 0x80 + ((iVar35 + iVar20) * local_6c0 + 0x100 >> 9);
              iVar23 = 0;
              local_720 = paiVar37;
              if (lVar44 < lVar11) {
                iVar23 = 1;
                piVar22 = (int *)(ulong)(uint)(iVar35 + iVar20);
                local_720 = _col_6;
                lVar11 = lVar44;
              }
            }
            iVar20 = (int)local_718;
            _col = (int (*) [26])CONCAT44(uStack_6f4,iVar23);
            lVar44 = (long)((long)local_738 + (long)paiVar37) * 0x80 +
                     ((iVar20 + (int)local_730) * local_6c0 + 0x100 >> 9);
            if ((((long)local_710 < 6) + 1 < uVar43 || sharpness == 0) &&
               (lVar42 = (long)local_670 * 0x80 +
                         (((int)local_6a0 + iVar20) * local_6c0 + 0x100 >> 9), lVar42 < lVar44)) {
              local_698 = (int (*) [26])CONCAT44(SUB84(paiVar38,4),1);
              local_730 = (int (*) [26])((ulong)local_6a0 & 0xffffffff);
              paiVar37 = _col_6;
              lVar44 = lVar42;
            }
            if ((sharpness == 0 || 3 < (long)local_710) && (lVar11 < lVar44)) {
              if (0 < (int)uVar24) {
                uVar32 = 0;
                do {
                  iVar20 = nz_ci[uVar32];
                  levels_buf[iVar20 + (iVar20 >> (bVar3 & 0x1f)) * 4] = '\0';
                  local_6c8[iVar20] = 0;
                  local_6b8[iVar20] = 0;
                  uVar32 = uVar32 + 1;
                } while (uVar24 != uVar32);
              }
              uVar24 = 0;
              local_6a8 = local_650;
              local_738 = local_720;
            }
            else {
              local_738 = (int (*) [26])((long)*local_738 + (long)*paiVar37);
              piVar22 = (int *)(ulong)(uint)((int)local_730 + iVar20);
              iVar23 = (int)local_698;
            }
            if (iVar23 != 0) {
              local_6c8[(int)uVar7] = (tran_low_t)local_6f0;
              local_6b8[(int)uVar7] = (tran_low_t)local_640;
              uVar4 = (uint8_t)uVar9;
              if (0x7e < (int)uVar9) {
                uVar4 = '\x7f';
              }
              *local_5f8 = uVar4;
            }
            piVar34 = local_6e8;
            paiVar47 = local_710;
            ptVar40 = local_6b8;
            uVar33 = local_708;
            qcoeff = local_6c8;
            iqmatrix = local_688;
            if (local_6c8[(int)uVar7] != 0) {
              nz_ci[(int)uVar24] = (int)local_728;
              uVar24 = uVar24 + 1;
            }
          }
          paiVar38 = (int (*) [26])((long)(paiVar47 + -1) + 0x1f);
        } while ((0 < (long)paiVar47) && ((int)uVar24 < 3));
      }
      local_73c = (uint)piVar22;
      local_628 = local_738;
    }
  }
  iVar23 = local_6fc;
  iVar20 = (int)uVar33;
  uVar7 = (uint)paiVar38;
  if ((((sharpness == 0) && (uVar7 == 0xffffffff)) && ((int)uVar24 < 3)) &&
     (local_6c0 * iVar10 + 0x100 >> 9 <
      (long)local_628 * 0x80 + (((long)(int)local_73c + (long)iVar6) * local_6c0 + 0x100 >> 9))) {
    if (0 < (int)uVar24) {
      uVar32 = 0;
      do {
        iVar35 = nz_ci[uVar32];
        qcoeff[iVar35] = 0;
        ptVar40[iVar35] = 0;
        uVar32 = uVar32 + 1;
      } while (uVar24 != uVar32);
    }
    local_73c = 0;
    local_6a8 = (int (*) [26])0x0;
  }
  bVar3 = (byte)uVar33;
  bVar12 = (byte)local_708;
  bVar13 = (byte)local_6e0;
  if (local_61c == 0) {
    qcoeff = local_6c8;
    if (0 < (int)uVar7) {
      local_658 = (LV_MAP_EOB_COST *)(long)(1 << (bVar3 & 0x1f));
      local_718 = local_658->eob_cost[0] + 1;
      local_738 = (int (*) [26])(long)(2 << (bVar3 & 0x1f));
      local_710 = local_6d0->base_cost;
      local_720 = local_6d0->lps_cost;
      lVar11 = ((ulong)paiVar38 & 0xffffffff) + 1;
      do {
        sVar1 = piVar34[lVar11 + -1];
        iVar35 = (int)sVar1;
        iVar20 = (int)local_610[sVar1 != 0];
        if (iqmatrix != (qm_val_t *)0x0) {
          iVar20 = (int)((uint)iqmatrix[iVar35] * iVar20 + 0x10) >> 5;
        }
        iVar36 = iVar35 >> (bVar12 & 0x1f);
        lVar44 = (long)(iVar35 + iVar36 * 4);
        paiVar37 = (int (*) [26])(levels_buf + lVar44);
        if (sVar1 == 0) {
          lVar44 = 0;
        }
        else {
          uVar7 = (uint)""[levels_buf[lVar44 + 2]] +
                  (uint)""[(levels_buf + lVar44 + 8)[(long)local_738]] +
                  (uint)""[(levels_buf + lVar44 + 5)[(long)local_658]] +
                  (uint)""[levels_buf[lVar44 + 1]] +
                  (uint)""[*(byte *)((long)*paiVar37 + (long)local_718)] + 1 >> 1;
          uVar32 = (ulong)uVar7;
          if (3 < uVar7) {
            uVar32 = 4;
          }
          lVar44 = uVar32 + (long)av1_nz_map_ctx_offset[(long)local_690][iVar35];
        }
        uVar7 = local_6c8[iVar35];
        if (uVar7 == 0) {
          iVar30 = local_710[lVar44][0];
        }
        else {
          uVar24 = -uVar7;
          if (0 < (int)uVar7) {
            uVar24 = uVar7;
          }
          uVar9 = local_630[iVar35];
          uVar8 = -uVar9;
          if (0 < (int)uVar9) {
            uVar8 = uVar9;
          }
          uVar9 = local_6b8[iVar35];
          uVar15 = -uVar9;
          if (0 < (int)uVar9) {
            uVar15 = uVar9;
          }
          iVar41 = 0;
          uVar32 = 3;
          if ((int)uVar24 < 3) {
            uVar32 = (ulong)uVar24;
          }
          if (uVar24 < 4) {
            iVar41 = local_710[lVar44][(ulong)uVar24 + 4];
          }
          iVar30 = local_710[lVar44][uVar32] + 0x200;
          if (2 < uVar24) {
            iVar31 = iVar35 - (iVar36 << (bVar12 & 0x1f));
            iVar16 = iVar36 * (int)local_718 + iVar31;
            lVar44 = (long)(iVar16 + (int)local_718);
            uVar9 = (uint)levels_buf[lVar44 + 1] +
                    (uint)levels_buf[lVar44] + (uint)levels_buf[(long)iVar16 + 1] + 1 >> 1;
            if (5 < uVar9) {
              uVar9 = 6;
            }
            if (sVar1 != 0) {
              if ((iVar36 < 2) && (iVar31 < 2)) {
                uVar9 = uVar9 + 7;
              }
              else {
                uVar9 = uVar9 + 0xe;
              }
            }
            uVar43 = 0 >> (bVar12 & 0x1f);
            iVar36 = 0;
            uVar21 = 0xf;
            if ((int)uVar24 < 0xf) {
              uVar21 = uVar24;
            }
            paiVar39 = (int (*) [26])(ulong)uVar21;
            if (uVar24 < 0x10) {
              iVar36 = local_720[uVar9][(long)((long)*paiVar39 + 10)];
            }
            if (0xe < uVar24) {
              uVar21 = uVar24 - 0xe;
              if (uVar24 < 0x2e) {
                uVar43 = golomb_bits_cost[uVar21];
                iVar16 = golomb_cost_diff[uVar21];
              }
              else {
                uVar43 = 0x1f;
                if (uVar21 != 0) {
                  for (; uVar21 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                  }
                }
                uVar43 = (uVar43 ^ 0x1f) << 10 ^ 0x7e00;
                local_6f0 = CONCAT44(local_6f0._4_4_,uVar24 - 0xf);
                iVar16 = (uint)((uVar24 - 0xf & uVar21) == 0) * 0x400;
              }
              iVar36 = iVar36 + iVar16;
              _col = paiVar39;
            }
            iVar30 = uVar43 + iVar30 + local_720[(ulong)uVar9 - 1][(long)((long)*paiVar39 + 0x17)];
            iVar41 = iVar41 + iVar36;
          }
          local_728 = (int (*) [26])CONCAT44(local_728._4_4_,iVar41);
          local_730 = paiVar37;
          if (uVar8 < uVar15 || uVar8 - uVar15 == 0) {
            lVar44 = (long)(int)(uVar8 - uVar15 << (bVar13 & 0x1f));
            if (local_638 == (qm_val_t *)0x0) {
              uVar32 = lVar44 * lVar44;
            }
            else {
              uVar32 = (ulong)local_638[iVar35] * lVar44 * (ulong)local_638[iVar35] * lVar44 + 0x200
                       >> 10;
            }
            uVar9 = uVar24 - 1;
            uVar15 = (int)(iVar20 * uVar9) >> (bVar13 & 0x1f);
            lVar44 = (long)(int)(uVar8 - uVar15 << (bVar13 & 0x1f));
            if (local_638 == (qm_val_t *)0x0) {
              uVar33 = lVar44 * lVar44;
            }
            else {
              uVar33 = (ulong)local_638[iVar35] * lVar44 * (ulong)local_638[iVar35] * lVar44 + 0x200
                       >> 10;
            }
            if ((sharpness == 0 || 1 < uVar24) &&
               ((long)(uVar33 * 0x80 + ((iVar30 - iVar41) * local_6c0 + 0x100 >> 9)) <
                (long)(uVar32 * 0x80 + (iVar30 * local_6c0 + 0x100 >> 9)))) {
              uVar7 = (int)uVar7 >> 0x1f;
              local_6c8[iVar35] = (uVar9 ^ uVar7) + -uVar7;
              local_6b8[iVar35] = (uVar15 ^ uVar7) + -uVar7;
              if (0x7e < (int)uVar9) {
                uVar9 = 0x7f;
              }
              *(uint8_t *)*paiVar37 = (uint8_t)uVar9;
              iVar30 = iVar30 - iVar41;
            }
          }
        }
        local_73c = local_73c + iVar30;
        lVar11 = lVar11 + -1;
        uVar7 = (int)paiVar38 - 1;
        paiVar38 = (int (*) [26])(ulong)uVar7;
        piVar34 = local_6e8;
        uVar33 = local_708;
        iqmatrix = local_688;
      } while (1 < lVar11);
    }
  }
  else {
    if (local_61c == 1) {
      if (0 < (int)uVar7) {
        local_728 = (int (*) [26])((long)(1 << (bVar3 & 0x1f)) + 4);
        local_730 = (int (*) [26])(long)(2 << (bVar3 & 0x1f));
        local_658 = (LV_MAP_EOB_COST *)(long)(3 << (bVar3 & 0x1f));
        local_738 = (int (*) [26])(long)(4 << (bVar3 & 0x1f));
        local_690 = local_6d0->base_cost;
        iVar20 = (int)local_728;
        local_718 = (int *)CONCAT44(local_718._4_4_,iVar20 * 2);
        local_720 = local_6d0->lps_cost;
        lVar11 = ((ulong)paiVar38 & 0xffffffff) + 1;
        do {
          sVar1 = piVar34[lVar11 + -1];
          iVar35 = (int)sVar1;
          iVar36 = (int)local_610[sVar1 != 0];
          if (iqmatrix != (qm_val_t *)0x0) {
            iVar36 = (int)((uint)iqmatrix[iVar35] * iVar36 + 0x10) >> 5;
          }
          iVar30 = iVar35 >> ((byte)uVar33 & 0x1f);
          lVar44 = (long)(iVar35 + iVar30 * 4);
          puVar46 = levels_buf + lVar44;
          uVar7 = (uint)""[*(byte *)((long)(*local_738 + 4) + (long)puVar46)] +
                  (uint)""[*(byte *)((long)(local_658->eob_cost[0] + 3) + (long)puVar46)] +
                  (uint)""[*(byte *)((long)(*local_730 + 2) + (long)puVar46)] +
                  (uint)""[levels_buf[lVar44 + 1]] +
                  (uint)""[puVar46[(long)((long)(local_728 + -0xe) + 0x5b0)]] + 1 >> 1;
          uVar32 = (ulong)uVar7;
          if (3 < uVar7) {
            uVar32 = 4;
          }
          uVar7 = qcoeff[iVar35];
          if (uVar7 == 0) {
            iVar41 = local_690[uVar32 + (long)nz_map_ctx_offset_1d[iVar30]][0];
          }
          else {
            uVar24 = -uVar7;
            if (0 < (int)uVar7) {
              uVar24 = uVar7;
            }
            uVar9 = local_630[iVar35];
            uVar8 = -uVar9;
            if (0 < (int)uVar9) {
              uVar8 = uVar9;
            }
            uVar9 = ptVar40[iVar35];
            uVar15 = -uVar9;
            if (0 < (int)uVar9) {
              uVar15 = uVar9;
            }
            iVar41 = (int)(uVar32 + (long)nz_map_ctx_offset_1d[iVar30]);
            iVar16 = 0;
            uVar32 = 3;
            if ((int)uVar24 < 3) {
              uVar32 = (ulong)uVar24;
            }
            if (uVar24 < 4) {
              iVar16 = local_690[iVar41][(ulong)uVar24 + 4];
            }
            iVar41 = local_690[iVar41][uVar32] + 0x200;
            if (2 < uVar24) {
              iVar31 = iVar30 * iVar20 + (iVar35 - (iVar30 << (bVar12 & 0x1f)));
              uVar9 = (uint)levels_buf[iVar31 + iVar20 * 2] +
                      (uint)levels_buf[iVar20 + iVar31] + (uint)levels_buf[(long)iVar31 + 1] + 1 >>
                      1;
              if (5 < uVar9) {
                uVar9 = 6;
              }
              if (sVar1 != 0) {
                if (iVar30 == 0) {
                  uVar9 = uVar9 + 7;
                }
                else {
                  uVar9 = uVar9 + 0xe;
                }
              }
              uVar43 = 0;
              iVar30 = 0;
              uVar21 = 0xf;
              if ((int)uVar24 < 0xf) {
                uVar21 = uVar24;
              }
              paiVar37 = (int (*) [26])(ulong)uVar21;
              if (uVar24 < 0x10) {
                iVar30 = local_720[uVar9][(long)((long)*paiVar37 + 10)];
              }
              if (0xe < uVar24) {
                uVar21 = uVar24 - 0xe;
                if (uVar24 < 0x2e) {
                  local_6f0 = (ulong)uVar21;
                  uVar43 = golomb_bits_cost[local_6f0];
                  iVar31 = golomb_cost_diff[local_6f0];
                  uVar21 = local_73c;
                }
                else {
                  uVar43 = 0x1f;
                  if (uVar21 != 0) {
                    for (; uVar21 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                    }
                  }
                  uVar43 = (uVar43 ^ 0x1f) << 10 ^ 0x7e00;
                  local_6f0 = CONCAT44(local_6f0._4_4_,uVar24 - 0xf);
                  local_6b0 = CONCAT44(local_6b0._4_4_,iVar36);
                  iVar31 = (uint)((uVar24 - 0xf & uVar21) == 0) * 0x400;
                }
                _col_6 = (int (*) [26])CONCAT44(uStack_6d4,uVar21);
                iVar30 = iVar30 + iVar31;
                _col = paiVar37;
              }
              iVar41 = uVar43 + iVar41 + local_720[(ulong)uVar9 - 1][(long)((long)*paiVar37 + 0x17)]
              ;
              iVar16 = iVar16 + iVar30;
              qcoeff = local_6c8;
            }
            local_710 = (int (*) [8])CONCAT44(local_710._4_4_,iVar16);
            if (uVar8 < uVar15 || uVar8 - uVar15 == 0) {
              lVar44 = (long)(int)(uVar8 - uVar15 << (bVar13 & 0x1f));
              if (local_638 == (qm_val_t *)0x0) {
                uVar32 = lVar44 * lVar44;
              }
              else {
                uVar32 = (ulong)local_638[iVar35] * lVar44 * (ulong)local_638[iVar35] * lVar44 +
                         0x200 >> 10;
              }
              uVar15 = uVar24 - 1;
              uVar9 = (int)(iVar36 * uVar15) >> (bVar13 & 0x1f);
              lVar44 = (long)(int)(uVar8 - uVar9 << (bVar13 & 0x1f));
              if (local_638 == (qm_val_t *)0x0) {
                uVar33 = lVar44 * lVar44;
              }
              else {
                uVar33 = (ulong)local_638[iVar35] * lVar44 * (ulong)local_638[iVar35] * lVar44 +
                         0x200 >> 10;
              }
              qcoeff = local_6c8;
              if ((sharpness == 0 || 1 < uVar24) &&
                 ((long)(uVar33 * 0x80 + ((iVar41 - iVar16) * local_6c0 + 0x100 >> 9)) <
                  (long)(uVar32 * 0x80 + (iVar41 * local_6c0 + 0x100 >> 9)))) {
                uVar7 = (int)uVar7 >> 0x1f;
                local_6c8[iVar35] = (uVar15 ^ uVar7) + -uVar7;
                local_6b8[iVar35] = (uVar9 ^ uVar7) + -uVar7;
                uVar4 = (uint8_t)uVar15;
                if (0x7e < (int)uVar15) {
                  uVar4 = '\x7f';
                }
                *puVar46 = uVar4;
                iVar41 = iVar41 - iVar16;
              }
            }
          }
          local_73c = local_73c + iVar41;
          lVar11 = lVar11 + -1;
          uVar7 = (int)paiVar38 - 1;
          paiVar38 = (int (*) [26])(ulong)uVar7;
          piVar34 = local_6e8;
          ptVar40 = local_6b8;
          uVar33 = local_708;
          iqmatrix = local_688;
        } while (1 < lVar11);
      }
      iVar20 = (int)uVar33;
      goto LAB_0036da2e;
    }
    if (local_61c != 2) goto LAB_0036da2e;
    uVar33 = local_708;
    if (0 < (int)uVar7) {
      lVar11 = (long)(1 << (bVar3 & 0x1f));
      local_710 = (int (*) [8])(lVar11 + 4);
      uVar24 = ~(-1 << (bVar3 & 0x1f));
      local_738 = (int (*) [26])CONCAT44(local_738._4_4_,uVar24);
      local_690 = local_6d0->base_cost;
      local_720 = local_6d0->lps_cost;
      lVar44 = ((ulong)paiVar38 & 0xffffffff) + 1;
      do {
        sVar1 = piVar34[lVar44 + -1];
        uVar7 = (uint)sVar1;
        iVar20 = (int)local_610[sVar1 != 0];
        if (iqmatrix != (qm_val_t *)0x0) {
          iVar20 = (int)((uint)iqmatrix[(int)uVar7] * iVar20 + 0x10) >> 5;
        }
        iVar35 = (int)uVar7 >> (bVar12 & 0x1f);
        lVar42 = (long)(int)(uVar7 + iVar35 * 4);
        local_658 = (LV_MAP_EOB_COST *)(levels_buf + lVar42);
        uVar9 = (uint)""[levels_buf[lVar42 + 4]] +
                (uint)""[levels_buf[lVar42 + 3]] +
                (uint)""[levels_buf[lVar42 + 2]] + (uint)""[levels_buf[lVar42 + 1]] +
                (uint)""[*(byte *)((long)(local_658 + 0x10) + lVar11 + -0x57c)] + 1 >> 1;
        uVar32 = (ulong)uVar9;
        if (3 < uVar9) {
          uVar32 = 4;
        }
        uVar9 = qcoeff[(int)uVar7];
        if (uVar9 == 0) {
          iVar36 = local_690[uVar32 + (long)nz_map_ctx_offset_1d[uVar7 & uVar24]][0];
        }
        else {
          local_728 = (int (*) [26])CONCAT44(local_728._4_4_,iVar20);
          uVar8 = -uVar9;
          if (0 < (int)uVar9) {
            uVar8 = uVar9;
          }
          uVar15 = local_630[(int)uVar7];
          uVar43 = -uVar15;
          if (0 < (int)uVar15) {
            uVar43 = uVar15;
          }
          uVar15 = local_6b8[(int)uVar7];
          uVar21 = -uVar15;
          if (0 < (int)uVar15) {
            uVar21 = uVar15;
          }
          iVar36 = (int)(uVar32 + (long)nz_map_ctx_offset_1d[uVar7 & uVar24]);
          iVar30 = 0;
          uVar32 = 3;
          if ((int)uVar8 < 3) {
            uVar32 = (ulong)uVar8;
          }
          if (uVar8 < 4) {
            iVar30 = local_690[iVar36][(ulong)uVar8 + 4];
            iqmatrix = local_688;
          }
          iVar36 = local_690[iVar36][uVar32] + 0x200;
          if (2 < uVar8) {
            local_730 = (int (*) [26])CONCAT44(local_730._4_4_,iVar30);
            uVar14 = iVar35 << (bVar12 & 0x1f);
            iVar35 = iVar35 * (int)local_710 + (uVar7 - uVar14);
            uVar15 = (uint)levels_buf[(long)iVar35 + 2] +
                     (uint)levels_buf[iVar35 + (int)local_710] + (uint)levels_buf[(long)iVar35 + 1]
                     + 1 >> 1;
            if (5 < uVar15) {
              uVar15 = 6;
            }
            if (sVar1 != 0) {
              if (uVar7 == uVar14) {
                uVar15 = uVar15 + 7;
              }
              else {
                uVar15 = uVar15 + 0xe;
              }
            }
            uVar14 = 0;
            iVar35 = 0;
            uVar26 = 0xf;
            if ((int)uVar8 < 0xf) {
              uVar26 = uVar8;
            }
            local_718 = (int *)(ulong)uVar26;
            if (uVar8 < 0x10) {
              iVar35 = local_720[uVar15][(long)((long)local_718 + 10)];
            }
            if (0xe < uVar8) {
              uVar26 = uVar8 - 0xe;
              if (uVar8 < 0x2e) {
                uVar14 = golomb_bits_cost[uVar26];
                iVar35 = iVar35 + golomb_cost_diff[uVar26];
              }
              else {
                uVar14 = 0x1f;
                if (uVar26 != 0) {
                  for (; uVar26 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                  }
                }
                uVar14 = (uVar14 ^ 0x1f) << 10 ^ 0x7e00;
                local_730 = (int (*) [26])CONCAT44(local_730._4_4_,uVar8 - 0xf);
                iVar35 = iVar35 + (uint)((uVar8 - 0xf & uVar26) == 0) * 0x400;
              }
            }
            iVar36 = uVar14 + iVar36 + local_720[(ulong)uVar15 - 1][(long)((long)local_718 + 0x17)];
            iVar30 = iVar30 + iVar35;
            qcoeff = local_6c8;
            iqmatrix = local_688;
          }
          if (uVar43 < uVar21 || uVar43 - uVar21 == 0) {
            lVar42 = (long)(int)(uVar43 - uVar21 << (bVar13 & 0x1f));
            local_730 = (int (*) [26])CONCAT44(local_730._4_4_,iVar30);
            if (local_638 == (qm_val_t *)0x0) {
              uVar32 = lVar42 * lVar42;
            }
            else {
              uVar32 = (ulong)local_638[(int)uVar7] * lVar42 * (ulong)local_638[(int)uVar7] * lVar42
                       + 0x200 >> 10;
            }
            uVar15 = uVar8 - 1;
            uVar21 = (int)(iVar20 * uVar15) >> (bVar13 & 0x1f);
            local_728 = (int (*) [26])CONCAT44(local_728._4_4_,uVar21);
            lVar42 = (long)(int)(uVar43 - uVar21 << (bVar13 & 0x1f));
            if (local_638 == (qm_val_t *)0x0) {
              uVar33 = lVar42 * lVar42;
            }
            else {
              uVar33 = (ulong)local_638[(int)uVar7] * lVar42 * (ulong)local_638[(int)uVar7] * lVar42
                       + 0x200 >> 10;
            }
            if ((sharpness == 0 || 1 < uVar8) &&
               ((long)(uVar33 * 0x80 + ((iVar36 - iVar30) * local_6c0 + 0x100 >> 9)) <
                (long)(uVar32 * 0x80 + (iVar36 * local_6c0 + 0x100 >> 9)))) {
              uVar9 = (int)uVar9 >> 0x1f;
              qcoeff[(int)uVar7] = (uVar15 ^ uVar9) + -uVar9;
              local_6b8[(int)uVar7] = (uVar21 ^ uVar9) + -uVar9;
              uVar4 = (uint8_t)uVar15;
              if (0x7e < (int)uVar15) {
                uVar4 = '\x7f';
              }
              *(uint8_t *)local_658->eob_cost[0] = uVar4;
              iVar36 = iVar36 - iVar30;
            }
          }
        }
        local_73c = local_73c + iVar36;
        lVar44 = lVar44 + -1;
        uVar7 = (int)paiVar38 - 1;
        paiVar38 = (int (*) [26])(ulong)uVar7;
        piVar34 = local_6e8;
        uVar33 = local_708;
      } while (1 < lVar44);
    }
  }
  iVar20 = (int)uVar33;
  ptVar40 = local_6b8;
LAB_0036da2e:
  if (uVar7 == 0) {
    dummy_dist = 0;
    update_coeff_general
              ((int *)&local_73c,&dummy_dist,0,(int)local_6a8,tx_size,(TX_CLASS)local_61c,iVar20,
               (int)local_608,local_6c0,(int)local_6e0,txb_ctx->dc_sign_ctx,local_610,piVar34,
               local_6d0,local_630,qcoeff,ptVar40,levels_buf,iqmatrix,local_638);
  }
  if ((int)local_6a8 != 0) {
    iVar10 = get_tx_type_cost(x,local_678,iVar23,tx_size,tx_type_00,
                              (uint)(cpi->common).features.reduced_tx_set_used);
    iVar10 = iVar10 + iVar6;
  }
  uVar24 = iVar10 + local_73c;
  x->plane[plane].eobs[block] = (uint16_t)local_6a8;
  uVar7 = (uint)local_6a8;
  local_73c = uVar24;
  uVar4 = av1_get_txb_entropy_context
                    (qcoeff,(SCAN_ORDER *)((long)&av1_scan_orders[0][0].scan + uVar17 + uVar5),
                     uVar7 & 0xffff);
  x->plane[plane].txb_entropy_ctx[block] = uVar4;
  *rate_cost = uVar24;
  return uVar7;
}

Assistant:

int av1_optimize_txb(const struct AV1_COMP *cpi, MACROBLOCK *x, int plane,
                     int block, TX_SIZE tx_size, TX_TYPE tx_type,
                     const TXB_CTX *const txb_ctx, int *rate_cost,
                     int sharpness) {
  MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblock_plane *p = &x->plane[plane];
  const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
  const int16_t *scan = scan_order->scan;
  const int shift = av1_get_tx_scale(tx_size);
  int eob = p->eobs[block];
  const int16_t *dequant = p->dequant_QTX;
  const qm_val_t *iqmatrix =
      av1_get_iqmatrix(&cpi->common.quant_params, xd, plane, tx_size, tx_type);
  const qm_val_t *qmatrix =
      cpi->oxcf.tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR
          ? av1_get_qmatrix(&cpi->common.quant_params, xd, plane, tx_size,
                            tx_type)
          : NULL;
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  tran_low_t *dqcoeff = p->dqcoeff + block_offset;
  const tran_low_t *tcoeff = p->coeff + block_offset;
  const CoeffCosts *coeff_costs = &x->coeff_costs;

  // This function is not called if eob = 0.
  assert(eob > 0);

  const AV1_COMMON *cm = &cpi->common;
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const TX_CLASS tx_class = tx_type_to_class[tx_type];
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int bhl = get_txb_bhl(tx_size);
  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  assert(height == (1 << bhl));
  const int is_inter = is_inter_block(mbmi);
  const LV_MAP_COEFF_COST *txb_costs =
      &coeff_costs->coeff_costs[txs_ctx][plane_type];
  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const LV_MAP_EOB_COST *txb_eob_costs =
      &coeff_costs->eob_costs[eob_multi_size][plane_type];

  // For the IQ and SSIMULACRA 2 tunings, increase rshift from 2 to 4.
  // This biases trellis quantization towards keeping more coefficients, and
  // together with the IQ and SSIMULACRA2 rdmult adjustment in
  // av1_compute_rd_mult_based_on_qindex(), this helps preserve image
  // features (like repeating patterns and camera noise/film grain), which
  // improves SSIMULACRA 2 scores.
  const int rshift = (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
                      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2)
                         ? 7
                         : 5;

  const int64_t rdmult = ROUND_POWER_OF_TWO(
      (int64_t)x->rdmult * (8 - sharpness) *
          (plane_rd_mult[is_inter][plane_type] << (2 * (xd->bd - 8))),
      rshift);

  uint8_t levels_buf[TX_PAD_2D];
  uint8_t *const levels = set_levels(levels_buf, height);

  if (eob > 1) av1_txb_init_levels(qcoeff, width, height, levels);

  // TODO(angirbird): check iqmatrix

  const int non_skip_cost = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  const int skip_cost = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  const int eob_cost = get_eob_cost(eob, txb_eob_costs, txb_costs, tx_class);
  int accu_rate = eob_cost;
  int64_t accu_dist = 0;
  int si = eob - 1;
  const int ci = scan[si];
  const tran_low_t qc = qcoeff[ci];
  const tran_low_t abs_qc = abs(qc);
  const int sign = qc < 0;
  const int max_nz_num = 2;
  int nz_num = 1;
  int nz_ci[3] = { ci, 0, 0 };
  if (abs_qc >= 2) {
    update_coeff_general(&accu_rate, &accu_dist, si, eob, tx_size, tx_class,
                         bhl, width, rdmult, shift, txb_ctx->dc_sign_ctx,
                         dequant, scan, txb_costs, tcoeff, qcoeff, dqcoeff,
                         levels, iqmatrix, qmatrix);
    --si;
  } else {
    assert(abs_qc == 1);
    const int coeff_ctx = get_lower_levels_ctx_eob(bhl, width, si);
    accu_rate +=
        get_coeff_cost_eob(ci, abs_qc, sign, coeff_ctx, txb_ctx->dc_sign_ctx,
                           txb_costs, bhl, tx_class);
    const tran_low_t tqc = tcoeff[ci];
    const tran_low_t dqc = dqcoeff[ci];
    const int64_t dist = get_coeff_dist(tqc, dqc, shift, qmatrix, ci);
    const int64_t dist0 = get_coeff_dist(tqc, 0, shift, qmatrix, ci);
    accu_dist += dist - dist0;
    --si;
  }

#define UPDATE_COEFF_EOB_CASE(tx_class_literal)                            \
  case tx_class_literal:                                                   \
    for (; si >= 0 && nz_num <= max_nz_num; --si) {                        \
      update_coeff_eob(&accu_rate, &accu_dist, &eob, &nz_num, nz_ci, si,   \
                       tx_size, tx_class_literal, bhl, width,              \
                       txb_ctx->dc_sign_ctx, rdmult, shift, dequant, scan, \
                       txb_eob_costs, txb_costs, tcoeff, qcoeff, dqcoeff,  \
                       levels, sharpness, iqmatrix, qmatrix);              \
    }                                                                      \
    break
  switch (tx_class) {
    UPDATE_COEFF_EOB_CASE(TX_CLASS_2D);
    UPDATE_COEFF_EOB_CASE(TX_CLASS_HORIZ);
    UPDATE_COEFF_EOB_CASE(TX_CLASS_VERT);
#undef UPDATE_COEFF_EOB_CASE
    default: assert(false);
  }

  if (si == -1 && nz_num <= max_nz_num && sharpness == 0) {
    update_skip(&accu_rate, accu_dist, &eob, nz_num, nz_ci, rdmult, skip_cost,
                non_skip_cost, qcoeff, dqcoeff);
  }

#define UPDATE_COEFF_SIMPLE_CASE(tx_class_literal)                             \
  case tx_class_literal:                                                       \
    for (; si >= 1; --si) {                                                    \
      update_coeff_simple(&accu_rate, si, eob, tx_size, tx_class_literal, bhl, \
                          rdmult, shift, dequant, scan, txb_costs, tcoeff,     \
                          qcoeff, dqcoeff, levels, sharpness, iqmatrix,        \
                          qmatrix);                                            \
    }                                                                          \
    break
  switch (tx_class) {
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_2D);
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_HORIZ);
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_VERT);
#undef UPDATE_COEFF_SIMPLE_CASE
    default: assert(false);
  }

  // DC position
  if (si == 0) {
    // no need to update accu_dist because it's not used after this point
    int64_t dummy_dist = 0;
    update_coeff_general(&accu_rate, &dummy_dist, si, eob, tx_size, tx_class,
                         bhl, width, rdmult, shift, txb_ctx->dc_sign_ctx,
                         dequant, scan, txb_costs, tcoeff, qcoeff, dqcoeff,
                         levels, iqmatrix, qmatrix);
  }

  const int tx_type_cost = get_tx_type_cost(x, xd, plane, tx_size, tx_type,
                                            cm->features.reduced_tx_set_used);
  if (eob == 0)
    accu_rate += skip_cost;
  else
    accu_rate += non_skip_cost + tx_type_cost;

  p->eobs[block] = eob;
  p->txb_entropy_ctx[block] =
      av1_get_txb_entropy_context(qcoeff, scan_order, p->eobs[block]);

  *rate_cost = accu_rate;
  return eob;
}